

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O2

Symbol comment_type(Env *env)

{
  _Bool _Var1;
  int32_t iVar2;
  uint32_t rel;
  
  rel = 1;
  do {
    rel = rel + 1;
    iVar2 = peek(env,rel);
  } while (iVar2 == 0x2d);
  while( true ) {
    _Var1 = (*env->lexer->eof)(env->lexer);
    if (_Var1) {
      return COMMENT;
    }
    iVar2 = peek(env,rel);
    if ((iVar2 == 0x5e) || (iVar2 == 0x7c)) break;
    rel = rel + 1;
    _Var1 = is_space_char(iVar2);
    if (!_Var1) {
      return COMMENT;
    }
  }
  return HADDOCK;
}

Assistant:

static Symbol comment_type(Env *env) {
  uint32_t i = 2;
  while (peek(env, i) == '-') i++;
  while (not_eof(env)) {
    int32_t c = peek(env, i++);
    if (c == '|' || c == '^') return HADDOCK;
    else if (!is_space_char(c)) break;
  }
  return COMMENT;
}